

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_binary_expr.hpp
# Opt level: O2

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
                    *other)

{
  ostream *poVar1;
  ct_variable<0UL> local_3a;
  ct_constant<7L> local_39;
  string local_38 [32];
  
  poVar1 = std::operator<<(stream,"[");
  poVar1 = operator<<(poVar1,&local_39);
  op_div<double>::str_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = operator<<(poVar1,&local_3a);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_38);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_binary_expr<LHS, OP, RHS> const & other)
  {
    stream << "[" << other.lhs() << OP().str() << other.rhs() << "]";
    return stream;
  }